

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O2

void __thiscall cfd::core::Psbt::Join(Psbt *this,Psbt *transaction,bool ignore_duplicate_error)

{
  wally_psbt *wally_psbt_pointer;
  void *dest;
  Transaction TStack_58;
  
  dest = transaction->wally_psbt_pointer_;
  wally_psbt_pointer = MergePsbt(this->wally_psbt_pointer_,dest,ignore_duplicate_error);
  FreeWallyPsbtAddress((Psbt *)this->wally_psbt_pointer_,dest);
  this->wally_psbt_pointer_ = wally_psbt_pointer;
  RebuildTransaction(&TStack_58,wally_psbt_pointer);
  Transaction::operator=(&this->base_tx_,&TStack_58);
  Transaction::~Transaction(&TStack_58);
  return;
}

Assistant:

void Psbt::Join(const Psbt &transaction, bool ignore_duplicate_error) {
  struct wally_psbt *psbt_pointer = MergePsbt(
      wally_psbt_pointer_, transaction.wally_psbt_pointer_,
      ignore_duplicate_error);
  FreeWallyPsbtAddress(wally_psbt_pointer_);  // free
  wally_psbt_pointer_ = psbt_pointer;
  base_tx_ = RebuildTransaction(wally_psbt_pointer_);
}